

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locks.cc
# Opt level: O1

void __thiscall locks::locks(locks *this,int *lockParameters,char **names)

{
  int iVar1;
  lock *this_00;
  locks *this_01;
  undefined8 extraout_RAX;
  locks *this_02;
  void *unaff_R13;
  int configurationParameters [3];
  int local_34;
  int local_30;
  int local_2c;
  
  this->numberOfLocks = 0;
  this->numberOfKeys = 0;
  this->lastLockMatchedIndex = -1;
  if (lockParameters == (int *)0x0) {
    locks(this);
    operator_delete(unaff_R13,0x40);
    _Unwind_Resume(extraout_RAX);
  }
  do {
    local_34 = *lockParameters;
    if (local_34 == 0) {
      return;
    }
    local_30 = lockParameters[1];
    local_2c = lockParameters[2];
    this_00 = (lock *)operator_new(0x40);
    lock::lock(this_00,&local_34,*names);
    this->lockList[this->numberOfLocks] = this_00;
    this_01 = (locks *)operator_new(0x28);
    this_02 = this_01;
    decodeTextUtil::decodeTextUtil((decodeTextUtil *)this_01,&local_34,*names);
    iVar1 = this->numberOfLocks;
    names = names + 1;
    lockParameters = lockParameters + 3;
    this->decoderList[iVar1] = (decodeTextUtil *)this_01;
    this->numberOfLocks = iVar1 + 1;
  } while ((long)iVar1 < 9);
  locks(this_02);
  return;
}

Assistant:

locks::locks(const int * lockParameters, const char ** names) {
  numberOfLocks = 0;
  numberOfKeys = 0;
  lastLockMatchedIndex = -1;
  int configurationParameters[3];
  if (lockParameters) {
    while (*lockParameters != 0) {
      configurationParameters[0] = *lockParameters++;  // slope
      configurationParameters[1] = *lockParameters++;  // offset
      configurationParameters[2] = *lockParameters++;  // modulo
      lockList[numberOfLocks] = new lock(configurationParameters, *names);
      decoderList[numberOfLocks] = new decodeTextUtil(configurationParameters, *names);
      numberOfLocks++;
      names++;
      if (numberOfLocks >= MAX_NUMBER_OF_LOCKS) {
        fprintf(stderr, "Lock configuration is illegal - exceeded configured limit\n");
        exit(-1);
      }
    }
  } else {
    fprintf(stderr, "Lock configuration is illegal - no locks defined\n");
    exit(-1);
  }
}